

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,true,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  long lVar6;
  sel_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int64_t *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  idx_t iVar19;
  long lVar20;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    iVar19 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar19 = 0;
    lVar13 = 0;
    uVar8 = 0;
    uVar18 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar18 + 0x40;
        if (count <= uVar18 + 0x40) {
          uVar9 = count;
        }
LAB_014a2d20:
        uVar11 = uVar18;
        if (uVar18 < uVar9) {
          psVar2 = sel->sel_vector;
          lVar10 = ldata->micros;
          lVar17 = (long)ldata->days + lVar10 / 86400000000;
          lVar6 = lVar17 % 0x1e;
          lVar17 = (long)ldata->months + lVar17 / 0x1e;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          piVar12 = &rdata[uVar18].micros;
          do {
            uVar14 = uVar18;
            if (psVar2 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar2[uVar18];
            }
            lVar20 = (long)*(int32_t *)((long)piVar12 + -4) + *piVar12 / 86400000000;
            lVar16 = lVar20 % 0x1e;
            lVar20 = (long)((interval_t *)(piVar12 + -1))->months + lVar20 / 0x1e;
            if (lVar17 < lVar20) {
              bVar5 = false;
            }
            else {
              bVar5 = true;
              if (lVar17 <= lVar20) {
                if (lVar6 < lVar16) {
                  bVar5 = false;
                }
                else {
                  bVar5 = *piVar12 % 86400000000 <= lVar10 % 86400000000 || lVar16 < lVar6;
                }
              }
            }
            psVar3[iVar19] = (sel_t)uVar14;
            iVar19 = iVar19 + bVar5;
            psVar4[lVar13] = (sel_t)uVar14;
            lVar13 = (ulong)(bVar5 ^ 1) + lVar13;
            uVar18 = uVar18 + 1;
            piVar12 = piVar12 + 2;
            uVar11 = uVar9;
          } while (uVar9 != uVar18);
        }
      }
      else {
        uVar14 = puVar1[uVar8];
        uVar9 = uVar18 + 0x40;
        if (count <= uVar18 + 0x40) {
          uVar9 = count;
        }
        if (uVar14 == 0xffffffffffffffff) goto LAB_014a2d20;
        uVar11 = uVar9;
        if (uVar14 == 0) {
          if (uVar18 < uVar9) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              sVar7 = (sel_t)uVar18;
              if (psVar2 != (sel_t *)0x0) {
                sVar7 = psVar2[uVar18];
              }
              psVar3[lVar13] = sVar7;
              lVar13 = lVar13 + 1;
              uVar18 = uVar18 + 1;
            } while (uVar9 != uVar18);
          }
        }
        else {
          uVar11 = uVar18;
          if (uVar18 < uVar9) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            piVar12 = &rdata[uVar18].micros;
            uVar15 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar7 = (int)uVar18 + (int)uVar15;
              }
              else {
                sVar7 = psVar2[uVar18 + uVar15];
              }
              if ((uVar14 >> (uVar15 & 0x3f) & 1) == 0) {
LAB_014a3040:
                bVar5 = false;
              }
              else {
                lVar10 = (long)*(int32_t *)((long)piVar12 + -4) + *piVar12 / 86400000000;
                lVar6 = lVar10 % 0x1e;
                lVar20 = (long)((interval_t *)(piVar12 + -1))->months + lVar10 / 0x1e;
                lVar10 = (long)ldata->days + ldata->micros / 86400000000;
                lVar17 = lVar10 % 0x1e;
                lVar10 = (long)ldata->months + lVar10 / 0x1e;
                if (lVar10 < lVar20) {
                  bVar5 = false;
                }
                else {
                  bVar5 = true;
                  if (lVar10 <= lVar20) {
                    if (lVar17 < lVar6) goto LAB_014a3040;
                    bVar5 = *piVar12 % 86400000000 <= ldata->micros % 86400000000 || lVar6 < lVar17;
                  }
                }
              }
              psVar3[iVar19] = sVar7;
              iVar19 = iVar19 + bVar5;
              psVar4[lVar13] = sVar7;
              lVar13 = (ulong)(bVar5 ^ 1) + lVar13;
              uVar15 = uVar15 + 1;
              piVar12 = piVar12 + 2;
              uVar11 = uVar9;
            } while (uVar9 - uVar18 != uVar15);
          }
        }
      }
      uVar8 = uVar8 + 1;
      uVar18 = uVar11;
    } while (uVar8 != count + 0x3f >> 6);
  }
  return iVar19;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}